

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlDebugDumpDocumentHead(void)

{
  int iVar1;
  int iVar2;
  FILE *val;
  xmlDocPtr val_00;
  int local_2c;
  int n_doc;
  xmlDocPtr doc;
  int n_output;
  FILE *output;
  int mem_base;
  int test_ret;
  
  output._4_4_ = 0;
  for (doc._4_4_ = 0; (int)doc._4_4_ < 2; doc._4_4_ = doc._4_4_ + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_debug_FILE_ptr(doc._4_4_,0);
      val_00 = gen_xmlDocPtr(local_2c,1);
      xmlDebugDumpDocumentHead(val,val_00);
      call_tests = call_tests + 1;
      des_debug_FILE_ptr(doc._4_4_,val,0);
      des_xmlDocPtr(local_2c,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDebugDumpDocumentHead",(ulong)(uint)(iVar2 - iVar1));
        output._4_4_ = output._4_4_ + 1;
        printf(" %d",(ulong)doc._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return output._4_4_;
}

Assistant:

static int
test_xmlDebugDumpDocumentHead(void) {
    int test_ret = 0;

#if defined(LIBXML_DEBUG_ENABLED)
    int mem_base;
    FILE * output; /* the FILE * for the output */
    int n_output;
    xmlDocPtr doc; /* the document */
    int n_doc;

    for (n_output = 0;n_output < gen_nb_debug_FILE_ptr;n_output++) {
    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
        mem_base = xmlMemBlocks();
        output = gen_debug_FILE_ptr(n_output, 0);
        doc = gen_xmlDocPtr(n_doc, 1);

        xmlDebugDumpDocumentHead(output, doc);
        call_tests++;
        des_debug_FILE_ptr(n_output, output, 0);
        des_xmlDocPtr(n_doc, doc, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlDebugDumpDocumentHead",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_output);
            printf(" %d", n_doc);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}